

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

void __thiscall ON_PolyCurve::Dump(ON_PolyCurve *this,ON_TextLog *dump)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  ON_Curve **ppOVar4;
  double *pdVar5;
  double local_98;
  ON_3dPoint local_88;
  ON_3dPoint local_70;
  double local_58;
  double gap;
  ON_3dPoint segment_end;
  ON_3dPoint segment_start;
  int i;
  int count;
  ON_TextLog *dump_local;
  ON_PolyCurve *this_local;
  
  uVar3 = Count(this);
  segment_end.z = ON_3dPoint::UnsetPoint.x;
  gap = ON_3dPoint::UnsetPoint.x;
  segment_end.x = ON_3dPoint::UnsetPoint.y;
  segment_end.y = ON_3dPoint::UnsetPoint.z;
  ON_TextLog::Print(dump,"ON_PolyCurve segment count = %d\n",(ulong)uVar3);
  ON_TextLog::PushIndent(dump);
  for (segment_start.z._0_4_ = 0; segment_start.z._0_4_ < (int)uVar3;
      segment_start.z._0_4_ = segment_start.z._0_4_ + 1) {
    ppOVar4 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,segment_start.z._0_4_);
    if (*ppOVar4 == (ON_Curve *)0x0) {
      segment_end.z = ON_3dPoint::UnsetPoint.x;
    }
    else {
      ppOVar4 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,segment_start.z._0_4_
                          );
      ON_Curve::PointAtStart(&local_70,*ppOVar4);
      segment_end.z = local_70.x;
    }
    bVar2 = ON_3dPoint::IsValid((ON_3dPoint *)&segment_end.z);
    if ((bVar2) && (bVar2 = ON_3dPoint::IsValid((ON_3dPoint *)&gap), bVar2)) {
      local_98 = ON_3dPoint::DistanceTo((ON_3dPoint *)&segment_end.z,(ON_3dPoint *)&gap);
    }
    else {
      local_98 = -1.23432101234321e+308;
    }
    local_58 = local_98;
    pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,segment_start.z._0_4_);
    dVar1 = *pdVar5;
    pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,segment_start.z._0_4_ + 1);
    ON_TextLog::Print(dump,"Segment %d: (%g,%g)",dVar1,*pdVar5,(ulong)(segment_start.z._0_4_ + 1));
    if (0 < segment_start.z._0_4_) {
      bVar2 = ON_IsValid(local_58);
      if (bVar2) {
        ON_TextLog::Print(dump," gap = %.17g",local_58);
      }
      else {
        bVar2 = ON_3dPoint::IsValid((ON_3dPoint *)&segment_end.z);
        if (bVar2) {
          bVar2 = ON_3dPoint::IsValid((ON_3dPoint *)&gap);
          if (!bVar2) {
            ON_TextLog::Print(dump," invalid previous segment curve");
          }
        }
        else {
          ON_TextLog::Print(dump," invalid segment curve");
        }
      }
    }
    ON_TextLog::Print(dump,"\n");
    ON_TextLog::PushIndent(dump);
    ppOVar4 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,segment_start.z._0_4_);
    if (*ppOVar4 == (ON_Curve *)0x0) {
      ON_TextLog::Print(dump,"null curve pointer\n");
      gap = ON_3dPoint::UnsetPoint.x;
      segment_end.x = ON_3dPoint::UnsetPoint.y;
      segment_end.y = ON_3dPoint::UnsetPoint.z;
    }
    else {
      ppOVar4 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,segment_start.z._0_4_
                          );
      (*((*ppOVar4)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[7])(*ppOVar4,dump);
      ppOVar4 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,segment_start.z._0_4_
                          );
      ON_Curve::PointAtEnd(&local_88,*ppOVar4);
      gap = local_88.x;
      segment_end.x = local_88.y;
      segment_end.y = local_88.z;
    }
    ON_TextLog::PopIndent(dump);
  }
  ON_TextLog::PopIndent(dump);
  return;
}

Assistant:

void ON_PolyCurve::Dump( ON_TextLog& dump ) const
{
  const int count = Count();
  int i;

  ON_3dPoint segment_start = ON_3dPoint::UnsetPoint;
  ON_3dPoint segment_end = ON_3dPoint::UnsetPoint;
  double gap;

  dump.Print( "ON_PolyCurve segment count = %d\n", count );
  dump.PushIndent();
  for ( i = 0; i < count; i++ )
  {
    if ( 0 != m_segment[i] )
      segment_start = m_segment[i]->PointAtStart();
    else
      segment_start = ON_3dPoint::UnsetPoint;
    gap = (segment_start.IsValid() && segment_end.IsValid())
        ? segment_start.DistanceTo(segment_end)
        : ON_UNSET_VALUE;
    dump.Print( "Segment %d: (%g,%g)", i+1, m_t[i], m_t[i+1] );
    if ( i > 0 )
    {
      if ( ON_IsValid(gap) )
        dump.Print(" gap = %.17g",gap);
      else if ( !segment_start.IsValid() )
        dump.Print(" invalid segment curve");
      else if ( !segment_end.IsValid() )
        dump.Print(" invalid previous segment curve");
    }
    dump.Print("\n");

    dump.PushIndent();
    if ( 0 == m_segment[i] )
    {
      dump.Print("null curve pointer\n");
      segment_end = ON_3dPoint::UnsetPoint;
    }
    else
    {
      m_segment[i]->Dump(dump);
      segment_end = m_segment[i]->PointAtEnd();
    }
    dump.PopIndent();
  }
  dump.PopIndent();
}